

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_console_outputter.hpp
# Opt level: O3

void __thiscall
hayai::ConsoleOutputter::EndTest
          (ConsoleOutputter *this,string *fixtureName,string *testName,
          TestParametersDescriptor *parameters,TestResult *result)

{
  uint64_t uVar1;
  size_t sVar2;
  ConsoleOutputter *pCVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar76;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  double dVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  TextColor local_60 [2];
  TestParametersDescriptor *local_58;
  double dStack_50;
  ConsoleOutputter *local_40;
  TextColor local_38 [2];
  
  local_60[0] = TextGreen;
  local_58 = parameters;
  poVar4 = operator<<(this->_stream,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[     DONE ]",0xc);
  local_60[1] = 7;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  Outputter::WriteTestNameToStream(this->_stream,fixtureName,testName,local_58);
  local_60[0] = TextDefault;
  poVar4 = operator<<(this->_stream,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 6;
  auVar78._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeTotal);
  auVar78._8_4_ = (int)(result->_timeTotal >> 0x20);
  auVar78._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((auVar78._8_8_ - 1.9342813113834067e+25) +
                      (auVar78._0_8_ - 4503599627370496.0)) / 1000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ms)",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_60[0] = TextBlue;
  local_40 = this;
  poVar4 = operator<<(this->_stream,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[   RUNS   ] ",0xd);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"       Average time: ",0x15);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 3;
  uVar1 = result->_timeTotal;
  auVar79._8_4_ = (int)(uVar1 >> 0x20);
  auVar79._0_8_ = uVar1;
  auVar79._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar80._8_4_ = (int)(lVar5 >> 0x23);
  auVar80._0_8_ = lVar6;
  auVar80._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     ((((auVar79._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar80._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," us ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
  local_38[1] = 2;
  poVar4 = operator<<(poVar4,local_38 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"~",1);
  poVar4 = std::ostream::_M_insert<double>(result->_timeStdDev / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," us",3);
  local_38[0] = TextDefault;
  poVar4 = operator<<(poVar4,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar172._8_4_ = (int)(lVar5 >> 0x23);
  auVar172._0_8_ = lVar6;
  auVar172._12_4_ = 0x45300000;
  auVar81._0_8_ =
       (auVar172._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  auVar171._0_8_ =
       ((double)(result->_timeTotal >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeTotal & 0xffffffff | 0x4330000000000000);
  auVar171._8_8_ =
       ((double)(result->_timeRunMin >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMin & 0xffffffff | 0x4330000000000000);
  auVar81._8_8_ = 0x408f400000000000;
  auVar172 = divpd(auVar171,auVar81);
  dStack_50 = auVar172._8_8_;
  local_58 = (TestParametersDescriptor *)(dStack_50 - auVar172._0_8_ / 1000.0);
  poVar4 = this->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Fastest time: ",0xe);
  auVar82._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeRunMin);
  auVar82._8_4_ = (int)(result->_timeRunMin >> 0x20);
  auVar82._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((auVar82._8_8_ - 1.9342813113834067e+25) +
                      (auVar82._0_8_ - 4503599627370496.0)) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar10._8_4_ = (int)(lVar5 >> 0x23);
  auVar10._0_8_ = lVar6;
  auVar10._12_4_ = 0x45300000;
  auVar83._0_8_ =
       (auVar10._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  auVar11._0_8_ =
       ((double)(result->_timeTotal >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeTotal & 0xffffffff | 0x4330000000000000);
  auVar11._8_8_ =
       ((double)(result->_timeRunMin >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMin & 0xffffffff | 0x4330000000000000);
  auVar83._8_8_ = 0x408f400000000000;
  auVar172 = divpd(auVar11,auVar83);
  local_60[0] = (uint)(auVar172._0_8_ / 1000.0 < auVar172._8_8_) * 2 + TextGreen;
  poVar4 = operator<<(poVar4,local_60);
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar12._8_4_ = (int)(lVar5 >> 0x23);
  auVar12._0_8_ = lVar6;
  auVar12._12_4_ = 0x45300000;
  auVar84._0_8_ =
       (auVar12._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  auVar13._0_8_ =
       ((double)(result->_timeTotal >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeTotal & 0xffffffff | 0x4330000000000000);
  auVar13._8_8_ =
       ((double)(result->_timeRunMin >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMin & 0xffffffff | 0x4330000000000000);
  auVar84._8_8_ = 0x408f400000000000;
  auVar172 = divpd(auVar13,auVar84);
  dVar77 = auVar172._0_8_ / 1000.0;
  pcVar8 = "";
  if (dVar77 < auVar172._8_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,(ulong)(dVar77 < auVar172._8_8_))
  ;
  poVar4 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar14._8_4_ = (int)(lVar5 >> 0x23);
  auVar14._0_8_ = lVar6;
  auVar14._12_4_ = 0x45300000;
  auVar85._0_8_ =
       (auVar14._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  auVar15._0_8_ =
       ((double)(result->_timeTotal >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeTotal & 0xffffffff | 0x4330000000000000);
  auVar15._8_8_ =
       ((double)(result->_timeRunMin >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMin & 0xffffffff | 0x4330000000000000);
  auVar85._8_8_ = 0x408f400000000000;
  auVar172 = divpd(auVar15,auVar85);
  dVar77 = auVar172._0_8_ / 1000.0;
  pcVar8 = "";
  if (dVar77 < auVar172._8_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,(ulong)(dVar77 < auVar172._8_8_))
  ;
  uVar1 = result->_timeTotal;
  auVar16._8_4_ = (int)(uVar1 >> 0x20);
  auVar16._0_8_ = uVar1;
  auVar16._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar17._8_4_ = (int)(lVar5 >> 0x23);
  auVar17._0_8_ = lVar6;
  auVar17._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      ((((auVar16._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar17._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) / 1000.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," %",2);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar18._8_4_ = (int)(lVar5 >> 0x23);
  auVar18._0_8_ = lVar6;
  auVar18._12_4_ = 0x45300000;
  auVar201._0_8_ =
       ((double)(result->_timeRunMax >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMax & 0xffffffff | 0x4330000000000000);
  auVar201._8_8_ =
       ((double)(result->_timeTotal >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeTotal & 0xffffffff | 0x4330000000000000);
  auVar19._8_8_ =
       (auVar18._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  auVar19._0_8_ = 0x408f400000000000;
  auVar172 = divpd(auVar201,auVar19);
  dStack_50 = auVar172._8_8_;
  local_58 = (TestParametersDescriptor *)(auVar172._0_8_ - dStack_50 / 1000.0);
  poVar4 = local_40->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Slowest time: ",0xe);
  auVar86._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeRunMax);
  auVar86._8_4_ = (int)(result->_timeRunMax >> 0x20);
  auVar86._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((auVar86._8_8_ - 1.9342813113834067e+25) +
                      (auVar86._0_8_ - 4503599627370496.0)) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar87._8_4_ = (int)(lVar5 >> 0x23);
  auVar87._0_8_ = lVar6;
  auVar87._12_4_ = 0x45300000;
  auVar20._0_8_ =
       ((double)(result->_timeRunMax >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMax & 0xffffffff | 0x4330000000000000);
  auVar20._8_8_ =
       ((double)(result->_timeTotal >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeTotal & 0xffffffff | 0x4330000000000000);
  auVar88._8_8_ =
       (auVar87._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  auVar88._0_8_ = 0x408f400000000000;
  auVar172 = divpd(auVar20,auVar88);
  local_60[0] = (uint)(auVar172._8_8_ / 1000.0 < auVar172._0_8_) * 2 + TextGreen;
  poVar4 = operator<<(poVar4,local_60);
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar89._8_4_ = (int)(lVar5 >> 0x23);
  auVar89._0_8_ = lVar6;
  auVar89._12_4_ = 0x45300000;
  auVar21._0_8_ =
       ((double)(result->_timeRunMax >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMax & 0xffffffff | 0x4330000000000000);
  auVar21._8_8_ =
       ((double)(result->_timeTotal >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeTotal & 0xffffffff | 0x4330000000000000);
  auVar90._8_8_ =
       (auVar89._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  auVar90._0_8_ = 0x408f400000000000;
  auVar172 = divpd(auVar21,auVar90);
  dVar77 = auVar172._8_8_ / 1000.0;
  pcVar8 = "";
  if (dVar77 < auVar172._0_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,(ulong)(dVar77 < auVar172._0_8_))
  ;
  poVar4 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar91._8_4_ = (int)(lVar5 >> 0x23);
  auVar91._0_8_ = lVar6;
  auVar91._12_4_ = 0x45300000;
  auVar22._0_8_ =
       ((double)(result->_timeRunMax >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMax & 0xffffffff | 0x4330000000000000);
  auVar22._8_8_ =
       ((double)(result->_timeTotal >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeTotal & 0xffffffff | 0x4330000000000000);
  auVar92._8_8_ =
       (auVar91._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
  auVar92._0_8_ = 0x408f400000000000;
  auVar172 = divpd(auVar22,auVar92);
  dVar77 = auVar172._8_8_ / 1000.0;
  pcVar8 = "";
  if (dVar77 < auVar172._0_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,(ulong)(dVar77 < auVar172._0_8_))
  ;
  uVar1 = result->_timeTotal;
  auVar23._8_4_ = (int)(uVar1 >> 0x20);
  auVar23._0_8_ = uVar1;
  auVar23._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar24._8_4_ = (int)(lVar5 >> 0x23);
  auVar24._0_8_ = lVar6;
  auVar24._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      ((((auVar23._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar24._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) / 1000.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," %",2);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pCVar3 = local_40;
  poVar4 = local_40->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Median time: ",0xd);
  poVar4 = std::ostream::_M_insert<double>(result->_timeMedian / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," us (",5);
  local_60[0] = TextCyan;
  poVar4 = operator<<(poVar4,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"1st quartile: ",0xe);
  poVar4 = std::ostream::_M_insert<double>(result->_timeQuartile1 / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," us | 3rd quartile: ",0x14);
  poVar4 = std::ostream::_M_insert<double>(result->_timeQuartile3 / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," us",3);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = pCVar3->_stream;
  lVar5 = *(long *)poVar4;
  *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 8) = 5;
  *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"",0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = pCVar3->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Average performance: ",0x15);
  uVar1 = result->_timeTotal;
  auVar25._8_4_ = (int)(uVar1 >> 0x20);
  auVar25._0_8_ = uVar1;
  auVar25._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar26._8_4_ = (int)(lVar5 >> 0x23);
  auVar26._0_8_ = lVar6;
  auVar26._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (((auVar25._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar26._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," runs/s",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  auVar93._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeTotal);
  auVar93._8_4_ = (int)(result->_timeTotal >> 0x20);
  auVar93._12_4_ = 0x45300000;
  uVar7 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar27._0_8_ =
       ((double)(result->_timeRunMin >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMin & 0xffffffff | 0x4330000000000000);
  auVar27._8_8_ =
       ((double)(uVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(uVar7 & 0xffffffff | 0x4330000000000000);
  auVar202._8_8_ = (auVar93._8_8_ - 1.9342813113834067e+25) + (auVar93._0_8_ - 4503599627370496.0);
  auVar202._0_8_ = 0x41cdcd6500000000;
  auVar172 = divpd(auVar202,auVar27);
  dStack_50 = auVar172._8_8_;
  local_58 = (TestParametersDescriptor *)(auVar172._0_8_ - 1000000000.0 / dStack_50);
  poVar4 = pCVar3->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Best performance: ",0x12);
  auVar28._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeRunMin);
  auVar28._8_4_ = (int)(result->_timeRunMin >> 0x20);
  auVar28._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      ((auVar28._8_8_ - 1.9342813113834067e+25) +
                      (auVar28._0_8_ - 4503599627370496.0)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"runs/s",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  auVar94._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeTotal);
  auVar94._8_4_ = (int)(result->_timeTotal >> 0x20);
  auVar94._12_4_ = 0x45300000;
  uVar7 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar29._0_8_ =
       ((double)(result->_timeRunMin >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMin & 0xffffffff | 0x4330000000000000);
  auVar29._8_8_ =
       ((double)(uVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(uVar7 & 0xffffffff | 0x4330000000000000);
  auVar95._8_8_ = (auVar94._8_8_ - 1.9342813113834067e+25) + (auVar94._0_8_ - 4503599627370496.0);
  auVar95._0_8_ = 0x41cdcd6500000000;
  auVar172 = divpd(auVar95,auVar29);
  local_60[0] = (uint)(auVar172._0_8_ < 1000000000.0 / auVar172._8_8_) * 2 + TextGreen;
  poVar4 = operator<<(poVar4,local_60);
  auVar96._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeTotal);
  auVar96._8_4_ = (int)(result->_timeTotal >> 0x20);
  auVar96._12_4_ = 0x45300000;
  uVar7 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar30._0_8_ =
       ((double)(result->_timeRunMin >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMin & 0xffffffff | 0x4330000000000000);
  auVar30._8_8_ =
       ((double)(uVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(uVar7 & 0xffffffff | 0x4330000000000000);
  auVar97._8_8_ = (auVar96._8_8_ - 1.9342813113834067e+25) + (auVar96._0_8_ - 4503599627370496.0);
  auVar97._0_8_ = 0x41cdcd6500000000;
  auVar172 = divpd(auVar97,auVar30);
  dVar77 = 1000000000.0 / auVar172._8_8_;
  pcVar8 = "";
  if (dVar77 < auVar172._0_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,(ulong)(dVar77 < auVar172._0_8_))
  ;
  poVar4 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"runs/s",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
  auVar98._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeTotal);
  auVar98._8_4_ = (int)(result->_timeTotal >> 0x20);
  auVar98._12_4_ = 0x45300000;
  uVar7 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar31._0_8_ =
       ((double)(result->_timeRunMin >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMin & 0xffffffff | 0x4330000000000000);
  auVar31._8_8_ =
       ((double)(uVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(uVar7 & 0xffffffff | 0x4330000000000000);
  auVar99._8_8_ = (auVar98._8_8_ - 1.9342813113834067e+25) + (auVar98._0_8_ - 4503599627370496.0);
  auVar99._0_8_ = 0x41cdcd6500000000;
  auVar172 = divpd(auVar99,auVar31);
  dVar77 = 1000000000.0 / auVar172._8_8_;
  pcVar8 = "";
  if (dVar77 < auVar172._0_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,(ulong)(dVar77 < auVar172._0_8_))
  ;
  uVar1 = result->_timeTotal;
  auVar32._8_4_ = (int)(uVar1 >> 0x20);
  auVar32._0_8_ = uVar1;
  auVar32._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar33._8_4_ = (int)(lVar5 >> 0x23);
  auVar33._0_8_ = lVar6;
  auVar33._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (1000000000.0 /
                      (((auVar32._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar33._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," %",2);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  auVar100._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeTotal);
  auVar100._8_4_ = (int)(result->_timeTotal >> 0x20);
  auVar100._12_4_ = 0x45300000;
  uVar7 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar34._0_8_ =
       ((double)(result->_timeRunMax >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMax & 0xffffffff | 0x4330000000000000);
  auVar34._8_8_ =
       ((double)(uVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(uVar7 & 0xffffffff | 0x4330000000000000);
  auVar203._8_8_ = (auVar100._8_8_ - 1.9342813113834067e+25) + (auVar100._0_8_ - 4503599627370496.0)
  ;
  auVar203._0_8_ = 0x41cdcd6500000000;
  auVar172 = divpd(auVar203,auVar34);
  dStack_50 = auVar172._8_8_;
  local_58 = (TestParametersDescriptor *)(auVar172._0_8_ - 1000000000.0 / dStack_50);
  poVar4 = local_40->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Worst performance: ",0x13);
  auVar35._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeRunMax);
  auVar35._8_4_ = (int)(result->_timeRunMax >> 0x20);
  auVar35._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      ((auVar35._8_8_ - 1.9342813113834067e+25) +
                      (auVar35._0_8_ - 4503599627370496.0)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"runs/s",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  auVar101._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeTotal);
  auVar101._8_4_ = (int)(result->_timeTotal >> 0x20);
  auVar101._12_4_ = 0x45300000;
  uVar7 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar36._0_8_ =
       ((double)(result->_timeRunMax >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMax & 0xffffffff | 0x4330000000000000);
  auVar36._8_8_ =
       ((double)(uVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(uVar7 & 0xffffffff | 0x4330000000000000);
  auVar102._8_8_ = (auVar101._8_8_ - 1.9342813113834067e+25) + (auVar101._0_8_ - 4503599627370496.0)
  ;
  auVar102._0_8_ = 0x41cdcd6500000000;
  auVar172 = divpd(auVar102,auVar36);
  local_60[0] = (uint)(auVar172._0_8_ < 1000000000.0 / auVar172._8_8_) * 2 + TextGreen;
  poVar4 = operator<<(poVar4,local_60);
  auVar103._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeTotal);
  auVar103._8_4_ = (int)(result->_timeTotal >> 0x20);
  auVar103._12_4_ = 0x45300000;
  uVar7 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar37._0_8_ =
       ((double)(result->_timeRunMax >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMax & 0xffffffff | 0x4330000000000000);
  auVar37._8_8_ =
       ((double)(uVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(uVar7 & 0xffffffff | 0x4330000000000000);
  auVar104._8_8_ = (auVar103._8_8_ - 1.9342813113834067e+25) + (auVar103._0_8_ - 4503599627370496.0)
  ;
  auVar104._0_8_ = 0x41cdcd6500000000;
  auVar172 = divpd(auVar104,auVar37);
  dVar77 = 1000000000.0 / auVar172._8_8_;
  pcVar8 = "";
  if (dVar77 < auVar172._0_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,(ulong)(dVar77 < auVar172._0_8_))
  ;
  poVar4 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"runs/s",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
  auVar105._0_8_ = (double)CONCAT44(0x43300000,(int)result->_timeTotal);
  auVar105._8_4_ = (int)(result->_timeTotal >> 0x20);
  auVar105._12_4_ = 0x45300000;
  uVar7 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  auVar38._0_8_ =
       ((double)(result->_timeRunMax >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(result->_timeRunMax & 0xffffffff | 0x4330000000000000);
  auVar38._8_8_ =
       ((double)(uVar7 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)(uVar7 & 0xffffffff | 0x4330000000000000);
  auVar106._8_8_ = (auVar105._8_8_ - 1.9342813113834067e+25) + (auVar105._0_8_ - 4503599627370496.0)
  ;
  auVar106._0_8_ = 0x41cdcd6500000000;
  auVar172 = divpd(auVar106,auVar38);
  dVar77 = 1000000000.0 / auVar172._8_8_;
  pcVar8 = "";
  if (dVar77 < auVar172._0_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar8,(ulong)(dVar77 < auVar172._0_8_))
  ;
  uVar1 = result->_timeTotal;
  auVar39._8_4_ = (int)(uVar1 >> 0x20);
  auVar39._0_8_ = uVar1;
  auVar39._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar40._8_4_ = (int)(lVar5 >> 0x23);
  auVar40._0_8_ = lVar6;
  auVar40._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (1000000000.0 /
                      (((auVar39._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar40._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," %",2);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pCVar3 = local_40;
  poVar4 = local_40->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Median performance: ",0x14);
  poVar4 = std::ostream::_M_insert<double>(1000000000.0 / result->_timeMedian);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," runs/s (",9);
  local_60[0] = TextCyan;
  poVar4 = operator<<(poVar4,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"1st quartile: ",0xe);
  poVar4 = std::ostream::_M_insert<double>(1000000000.0 / result->_timeQuartile1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," | 3rd quartile: ",0x11);
  poVar4 = std::ostream::_M_insert<double>(1000000000.0 / result->_timeQuartile3);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = pCVar3->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"",0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_60[0] = TextBlue;
  poVar4 = operator<<(pCVar3->_stream,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"[ITERATIONS] ",0xd);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 8) = 3;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"       Average time: ",0x15);
  uVar1 = result->_timeTotal;
  auVar107._8_4_ = (int)(uVar1 >> 0x20);
  auVar107._0_8_ = uVar1;
  auVar107._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar108._8_4_ = (int)(lVar5 >> 0x23);
  auVar108._0_8_ = lVar6;
  auVar108._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar109._8_4_ = (int)(sVar2 >> 0x20);
  auVar109._0_8_ = sVar2;
  auVar109._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((((auVar107._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar108._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) /
                      ((auVar109._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," us ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(",1);
  local_38[1] = 2;
  poVar4 = operator<<(poVar4,local_38 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"~",1);
  auVar110._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar110._8_4_ = (int)(result->_iterations >> 0x20);
  auVar110._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     ((result->_timeStdDev /
                      ((auVar110._8_8_ - 1.9342813113834067e+25) +
                      (auVar110._0_8_ - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," us",3);
  local_38[0] = TextDefault;
  poVar4 = operator<<(poVar4,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  uVar1 = result->_timeRunMin;
  auVar41._8_4_ = (int)(uVar1 >> 0x20);
  auVar41._0_8_ = uVar1;
  auVar41._12_4_ = 0x45300000;
  auVar204._0_8_ =
       (auVar41._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar42._8_4_ = (int)(sVar2 >> 0x20);
  auVar42._0_8_ = sVar2;
  auVar42._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar42._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar111._8_4_ = (int)(uVar1 >> 0x20);
  auVar111._0_8_ = uVar1;
  auVar111._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar112._8_4_ = (int)(lVar5 >> 0x23);
  auVar112._0_8_ = lVar6;
  auVar112._12_4_ = 0x45300000;
  auVar204._8_8_ =
       ((auVar111._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar112._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar43._0_8_ = dVar76 + dVar77;
  auVar43._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar204,auVar43);
  auVar172 = divpd(auVar172,_DAT_0013c180);
  dStack_50 = auVar172._8_8_;
  local_58 = (TestParametersDescriptor *)(auVar172._0_8_ - dStack_50);
  poVar4 = pCVar3->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Fastest time: ",0xe);
  uVar1 = result->_timeRunMin;
  auVar113._8_4_ = (int)(uVar1 >> 0x20);
  auVar113._0_8_ = uVar1;
  auVar113._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar114._8_4_ = (int)(sVar2 >> 0x20);
  auVar114._0_8_ = sVar2;
  auVar114._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     ((((auVar113._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar114._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  uVar1 = result->_timeRunMin;
  auVar115._8_4_ = (int)(uVar1 >> 0x20);
  auVar115._0_8_ = uVar1;
  auVar115._12_4_ = 0x45300000;
  auVar44._0_8_ =
       (auVar115._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar116._8_4_ = (int)(sVar2 >> 0x20);
  auVar116._0_8_ = sVar2;
  auVar116._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar116._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar173._8_4_ = (int)(uVar1 >> 0x20);
  auVar173._0_8_ = uVar1;
  auVar173._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar174._8_4_ = (int)(lVar5 >> 0x23);
  auVar174._0_8_ = lVar6;
  auVar174._12_4_ = 0x45300000;
  auVar44._8_8_ =
       ((auVar173._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar174._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar117._0_8_ = dVar76 + dVar77;
  auVar117._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar44,auVar117);
  auVar172 = divpd(auVar172,_DAT_0013c180);
  local_60[0] = (uint)(auVar172._8_8_ < auVar172._0_8_) * 2 + TextGreen;
  poVar4 = operator<<(poVar4,local_60);
  uVar1 = result->_timeRunMin;
  auVar118._8_4_ = (int)(uVar1 >> 0x20);
  auVar118._0_8_ = uVar1;
  auVar118._12_4_ = 0x45300000;
  auVar45._0_8_ =
       (auVar118._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar119._8_4_ = (int)(sVar2 >> 0x20);
  auVar119._0_8_ = sVar2;
  auVar119._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar119._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar175._8_4_ = (int)(uVar1 >> 0x20);
  auVar175._0_8_ = uVar1;
  auVar175._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar176._8_4_ = (int)(lVar5 >> 0x23);
  auVar176._0_8_ = lVar6;
  auVar176._12_4_ = 0x45300000;
  auVar45._8_8_ =
       ((auVar175._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar176._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar120._0_8_ = dVar76 + dVar77;
  auVar120._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar45,auVar120);
  auVar172 = divpd(auVar172,_DAT_0013c180);
  pcVar8 = "";
  if (auVar172._8_8_ < auVar172._0_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,pcVar8,(ulong)(auVar172._8_8_ < auVar172._0_8_));
  poVar4 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
  uVar1 = result->_timeRunMin;
  auVar121._8_4_ = (int)(uVar1 >> 0x20);
  auVar121._0_8_ = uVar1;
  auVar121._12_4_ = 0x45300000;
  auVar46._0_8_ =
       (auVar121._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar122._8_4_ = (int)(sVar2 >> 0x20);
  auVar122._0_8_ = sVar2;
  auVar122._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar122._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar177._8_4_ = (int)(uVar1 >> 0x20);
  auVar177._0_8_ = uVar1;
  auVar177._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar178._8_4_ = (int)(lVar5 >> 0x23);
  auVar178._0_8_ = lVar6;
  auVar178._12_4_ = 0x45300000;
  auVar46._8_8_ =
       ((auVar177._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar178._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar123._0_8_ = dVar76 + dVar77;
  auVar123._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar46,auVar123);
  auVar172 = divpd(auVar172,_DAT_0013c180);
  pcVar8 = "";
  if (auVar172._8_8_ < auVar172._0_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,pcVar8,(ulong)(auVar172._8_8_ < auVar172._0_8_));
  uVar1 = result->_timeTotal;
  auVar124._8_4_ = (int)(uVar1 >> 0x20);
  auVar124._0_8_ = uVar1;
  auVar124._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar125._8_4_ = (int)(lVar5 >> 0x23);
  auVar125._0_8_ = lVar6;
  auVar125._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar126._8_4_ = (int)(sVar2 >> 0x20);
  auVar126._0_8_ = sVar2;
  auVar126._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (((((auVar124._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                        ((auVar125._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) /
                       ((auVar126._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))) / 1000.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," %",2);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  uVar1 = result->_timeRunMax;
  auVar47._8_4_ = (int)(uVar1 >> 0x20);
  auVar47._0_8_ = uVar1;
  auVar47._12_4_ = 0x45300000;
  auVar205._0_8_ =
       (auVar47._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar48._8_4_ = (int)(sVar2 >> 0x20);
  auVar48._0_8_ = sVar2;
  auVar48._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar48._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar127._8_4_ = (int)(uVar1 >> 0x20);
  auVar127._0_8_ = uVar1;
  auVar127._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar128._8_4_ = (int)(lVar5 >> 0x23);
  auVar128._0_8_ = lVar6;
  auVar128._12_4_ = 0x45300000;
  auVar205._8_8_ =
       ((auVar127._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar128._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar49._0_8_ = dVar76 + dVar77;
  auVar49._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar205,auVar49);
  auVar172 = divpd(auVar172,_DAT_0013c180);
  dStack_50 = auVar172._8_8_;
  local_58 = (TestParametersDescriptor *)(auVar172._0_8_ - dStack_50);
  poVar4 = local_40->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Slowest time: ",0xe);
  uVar1 = result->_timeRunMax;
  auVar129._8_4_ = (int)(uVar1 >> 0x20);
  auVar129._0_8_ = uVar1;
  auVar129._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar130._8_4_ = (int)(sVar2 >> 0x20);
  auVar130._0_8_ = sVar2;
  auVar130._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     ((((auVar129._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar130._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  uVar1 = result->_timeRunMax;
  auVar131._8_4_ = (int)(uVar1 >> 0x20);
  auVar131._0_8_ = uVar1;
  auVar131._12_4_ = 0x45300000;
  auVar50._0_8_ =
       (auVar131._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar132._8_4_ = (int)(sVar2 >> 0x20);
  auVar132._0_8_ = sVar2;
  auVar132._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar132._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar179._8_4_ = (int)(uVar1 >> 0x20);
  auVar179._0_8_ = uVar1;
  auVar179._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar180._8_4_ = (int)(lVar5 >> 0x23);
  auVar180._0_8_ = lVar6;
  auVar180._12_4_ = 0x45300000;
  auVar50._8_8_ =
       ((auVar179._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar180._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar133._0_8_ = dVar76 + dVar77;
  auVar133._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar50,auVar133);
  auVar172 = divpd(auVar172,_DAT_0013c180);
  local_60[0] = (uint)(auVar172._8_8_ < auVar172._0_8_) * 2 + TextGreen;
  poVar4 = operator<<(poVar4,local_60);
  uVar1 = result->_timeRunMax;
  auVar134._8_4_ = (int)(uVar1 >> 0x20);
  auVar134._0_8_ = uVar1;
  auVar134._12_4_ = 0x45300000;
  auVar51._0_8_ =
       (auVar134._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar135._8_4_ = (int)(sVar2 >> 0x20);
  auVar135._0_8_ = sVar2;
  auVar135._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar135._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar181._8_4_ = (int)(uVar1 >> 0x20);
  auVar181._0_8_ = uVar1;
  auVar181._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar182._8_4_ = (int)(lVar5 >> 0x23);
  auVar182._0_8_ = lVar6;
  auVar182._12_4_ = 0x45300000;
  auVar51._8_8_ =
       ((auVar181._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar182._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar136._0_8_ = dVar76 + dVar77;
  auVar136._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar51,auVar136);
  auVar172 = divpd(auVar172,_DAT_0013c180);
  pcVar8 = "";
  if (auVar172._8_8_ < auVar172._0_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,pcVar8,(ulong)(auVar172._8_8_ < auVar172._0_8_));
  poVar4 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"us",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
  uVar1 = result->_timeRunMax;
  auVar137._8_4_ = (int)(uVar1 >> 0x20);
  auVar137._0_8_ = uVar1;
  auVar137._12_4_ = 0x45300000;
  auVar52._0_8_ =
       (auVar137._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar138._8_4_ = (int)(sVar2 >> 0x20);
  auVar138._0_8_ = sVar2;
  auVar138._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar138._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar183._8_4_ = (int)(uVar1 >> 0x20);
  auVar183._0_8_ = uVar1;
  auVar183._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar184._8_4_ = (int)(lVar5 >> 0x23);
  auVar184._0_8_ = lVar6;
  auVar184._12_4_ = 0x45300000;
  auVar52._8_8_ =
       ((auVar183._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar184._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar139._0_8_ = dVar76 + dVar77;
  auVar139._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar52,auVar139);
  auVar172 = divpd(auVar172,_DAT_0013c180);
  pcVar8 = "";
  if (auVar172._8_8_ < auVar172._0_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,pcVar8,(ulong)(auVar172._8_8_ < auVar172._0_8_));
  uVar1 = result->_timeTotal;
  auVar140._8_4_ = (int)(uVar1 >> 0x20);
  auVar140._0_8_ = uVar1;
  auVar140._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar141._8_4_ = (int)(lVar5 >> 0x23);
  auVar141._0_8_ = lVar6;
  auVar141._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar142._8_4_ = (int)(sVar2 >> 0x20);
  auVar142._0_8_ = sVar2;
  auVar142._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (((((auVar140._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                        ((auVar141._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) /
                       ((auVar142._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))) / 1000.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," %",2);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  pCVar3 = local_40;
  poVar4 = local_40->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Median time: ",0xd);
  auVar143._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar143._8_4_ = (int)(result->_iterations >> 0x20);
  auVar143._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     ((result->_timeMedian /
                      ((auVar143._8_8_ - 1.9342813113834067e+25) +
                      (auVar143._0_8_ - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," us (",5);
  local_60[0] = TextCyan;
  poVar4 = operator<<(poVar4,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"1st quartile: ",0xe);
  auVar144._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar144._8_4_ = (int)(result->_iterations >> 0x20);
  auVar144._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     ((result->_timeQuartile1 /
                      ((auVar144._8_8_ - 1.9342813113834067e+25) +
                      (auVar144._0_8_ - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," us | 3rd quartile: ",0x14);
  auVar145._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar145._8_4_ = (int)(result->_iterations >> 0x20);
  auVar145._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     ((result->_timeQuartile3 /
                      ((auVar145._8_8_ - 1.9342813113834067e+25) +
                      (auVar145._0_8_ - 4503599627370496.0))) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," us",3);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = pCVar3->_stream;
  lVar5 = *(long *)poVar4;
  *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 8) = 5;
  *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"",0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = pCVar3->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Average performance: ",0x15);
  uVar1 = result->_timeTotal;
  auVar53._8_4_ = (int)(uVar1 >> 0x20);
  auVar53._0_8_ = uVar1;
  auVar53._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar54._8_4_ = (int)(lVar5 >> 0x23);
  auVar54._0_8_ = lVar6;
  auVar54._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar55._8_4_ = (int)(sVar2 >> 0x20);
  auVar55._0_8_ = sVar2;
  auVar55._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      ((((auVar53._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar54._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) /
                      ((auVar55._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," iterations/s",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  uVar1 = result->_timeRunMin;
  auVar146._8_4_ = (int)(uVar1 >> 0x20);
  auVar146._0_8_ = uVar1;
  auVar146._12_4_ = 0x45300000;
  auVar56._0_8_ =
       (auVar146._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar147._8_4_ = (int)(sVar2 >> 0x20);
  auVar147._0_8_ = sVar2;
  auVar147._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar147._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar185._8_4_ = (int)(uVar1 >> 0x20);
  auVar185._0_8_ = uVar1;
  auVar185._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar186._8_4_ = (int)(lVar5 >> 0x23);
  auVar186._0_8_ = lVar6;
  auVar186._12_4_ = 0x45300000;
  auVar56._8_8_ =
       ((auVar185._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar186._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar148._0_8_ = dVar76 + dVar77;
  auVar148._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar56,auVar148);
  auVar172 = divpd(_DAT_0013c190,auVar172);
  dStack_50 = auVar172._8_8_;
  local_58 = (TestParametersDescriptor *)(auVar172._0_8_ - dStack_50);
  poVar4 = pCVar3->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Best performance: ",0x12);
  uVar1 = result->_timeRunMin;
  auVar57._8_4_ = (int)(uVar1 >> 0x20);
  auVar57._0_8_ = uVar1;
  auVar57._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar58._8_4_ = (int)(sVar2 >> 0x20);
  auVar58._0_8_ = sVar2;
  auVar58._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (((auVar57._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar58._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"iterations/s",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  uVar1 = result->_timeRunMin;
  auVar149._8_4_ = (int)(uVar1 >> 0x20);
  auVar149._0_8_ = uVar1;
  auVar149._12_4_ = 0x45300000;
  auVar59._0_8_ =
       (auVar149._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar150._8_4_ = (int)(sVar2 >> 0x20);
  auVar150._0_8_ = sVar2;
  auVar150._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar150._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar187._8_4_ = (int)(uVar1 >> 0x20);
  auVar187._0_8_ = uVar1;
  auVar187._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar188._8_4_ = (int)(lVar5 >> 0x23);
  auVar188._0_8_ = lVar6;
  auVar188._12_4_ = 0x45300000;
  auVar59._8_8_ =
       ((auVar187._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar188._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar151._0_8_ = dVar76 + dVar77;
  auVar151._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar59,auVar151);
  auVar172 = divpd(_DAT_0013c190,auVar172);
  local_60[0] = (uint)(auVar172._0_8_ < auVar172._8_8_) * 2 + TextGreen;
  poVar4 = operator<<(poVar4,local_60);
  uVar1 = result->_timeRunMin;
  auVar152._8_4_ = (int)(uVar1 >> 0x20);
  auVar152._0_8_ = uVar1;
  auVar152._12_4_ = 0x45300000;
  auVar60._0_8_ =
       (auVar152._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar153._8_4_ = (int)(sVar2 >> 0x20);
  auVar153._0_8_ = sVar2;
  auVar153._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar153._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar189._8_4_ = (int)(uVar1 >> 0x20);
  auVar189._0_8_ = uVar1;
  auVar189._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar190._8_4_ = (int)(lVar5 >> 0x23);
  auVar190._0_8_ = lVar6;
  auVar190._12_4_ = 0x45300000;
  auVar60._8_8_ =
       ((auVar189._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar190._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar154._0_8_ = dVar76 + dVar77;
  auVar154._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar60,auVar154);
  auVar172 = divpd(_DAT_0013c190,auVar172);
  pcVar8 = "";
  pcVar9 = "";
  if (auVar172._8_8_ < auVar172._0_8_) {
    pcVar9 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,pcVar9,(ulong)(auVar172._8_8_ < auVar172._0_8_));
  poVar4 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"iterations/s",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
  uVar1 = result->_timeRunMin;
  auVar155._8_4_ = (int)(uVar1 >> 0x20);
  auVar155._0_8_ = uVar1;
  auVar155._12_4_ = 0x45300000;
  auVar61._0_8_ =
       (auVar155._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar156._8_4_ = (int)(sVar2 >> 0x20);
  auVar156._0_8_ = sVar2;
  auVar156._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar156._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar191._8_4_ = (int)(uVar1 >> 0x20);
  auVar191._0_8_ = uVar1;
  auVar191._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar192._8_4_ = (int)(lVar5 >> 0x23);
  auVar192._0_8_ = lVar6;
  auVar192._12_4_ = 0x45300000;
  auVar61._8_8_ =
       ((auVar191._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar192._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar157._0_8_ = dVar76 + dVar77;
  auVar157._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar61,auVar157);
  auVar172 = divpd(_DAT_0013c190,auVar172);
  pcVar9 = "";
  if (auVar172._8_8_ < auVar172._0_8_) {
    pcVar9 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,pcVar9,(ulong)(auVar172._8_8_ < auVar172._0_8_));
  uVar1 = result->_timeTotal;
  auVar62._8_4_ = (int)(uVar1 >> 0x20);
  auVar62._0_8_ = uVar1;
  auVar62._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar63._8_4_ = (int)(lVar5 >> 0x23);
  auVar63._0_8_ = lVar6;
  auVar63._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar64._8_4_ = (int)(sVar2 >> 0x20);
  auVar64._0_8_ = sVar2;
  auVar64._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (1000000000.0 /
                      ((((auVar62._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar63._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) /
                      ((auVar64._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," %",2);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  uVar1 = result->_timeRunMax;
  auVar158._8_4_ = (int)(uVar1 >> 0x20);
  auVar158._0_8_ = uVar1;
  auVar158._12_4_ = 0x45300000;
  auVar65._0_8_ =
       (auVar158._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar159._8_4_ = (int)(sVar2 >> 0x20);
  auVar159._0_8_ = sVar2;
  auVar159._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar159._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar193._8_4_ = (int)(uVar1 >> 0x20);
  auVar193._0_8_ = uVar1;
  auVar193._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar194._8_4_ = (int)(lVar5 >> 0x23);
  auVar194._0_8_ = lVar6;
  auVar194._12_4_ = 0x45300000;
  auVar65._8_8_ =
       ((auVar193._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar194._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar160._0_8_ = dVar76 + dVar77;
  auVar160._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar65,auVar160);
  auVar172 = divpd(_DAT_0013c190,auVar172);
  dStack_50 = auVar172._8_8_;
  local_58 = (TestParametersDescriptor *)(auVar172._0_8_ - dStack_50);
  poVar4 = local_40->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Worst performance: ",0x13);
  uVar1 = result->_timeRunMax;
  auVar66._8_4_ = (int)(uVar1 >> 0x20);
  auVar66._0_8_ = uVar1;
  auVar66._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar67._8_4_ = (int)(sVar2 >> 0x20);
  auVar67._0_8_ = sVar2;
  auVar67._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (((auVar66._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                      ((auVar67._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"iterations/s",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
  uVar1 = result->_timeRunMax;
  auVar161._8_4_ = (int)(uVar1 >> 0x20);
  auVar161._0_8_ = uVar1;
  auVar161._12_4_ = 0x45300000;
  auVar68._0_8_ =
       (auVar161._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar162._8_4_ = (int)(sVar2 >> 0x20);
  auVar162._0_8_ = sVar2;
  auVar162._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar162._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar195._8_4_ = (int)(uVar1 >> 0x20);
  auVar195._0_8_ = uVar1;
  auVar195._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar196._8_4_ = (int)(lVar5 >> 0x23);
  auVar196._0_8_ = lVar6;
  auVar196._12_4_ = 0x45300000;
  auVar68._8_8_ =
       ((auVar195._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar196._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar163._0_8_ = dVar76 + dVar77;
  auVar163._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar68,auVar163);
  auVar172 = divpd(_DAT_0013c190,auVar172);
  local_60[0] = (uint)(auVar172._0_8_ < auVar172._8_8_) * 2 + TextGreen;
  poVar4 = operator<<(poVar4,local_60);
  uVar1 = result->_timeRunMax;
  auVar164._8_4_ = (int)(uVar1 >> 0x20);
  auVar164._0_8_ = uVar1;
  auVar164._12_4_ = 0x45300000;
  auVar69._0_8_ =
       (auVar164._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar165._8_4_ = (int)(sVar2 >> 0x20);
  auVar165._0_8_ = sVar2;
  auVar165._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar165._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar197._8_4_ = (int)(uVar1 >> 0x20);
  auVar197._0_8_ = uVar1;
  auVar197._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar198._8_4_ = (int)(lVar5 >> 0x23);
  auVar198._0_8_ = lVar6;
  auVar198._12_4_ = 0x45300000;
  auVar69._8_8_ =
       ((auVar197._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar198._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar166._0_8_ = dVar76 + dVar77;
  auVar166._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar69,auVar166);
  auVar172 = divpd(_DAT_0013c190,auVar172);
  pcVar9 = "";
  if (auVar172._8_8_ < auVar172._0_8_) {
    pcVar9 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,pcVar9,(ulong)(auVar172._8_8_ < auVar172._0_8_));
  poVar4 = std::ostream::_M_insert<double>((double)local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"iterations/s",0xc);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," / ",3);
  uVar1 = result->_timeRunMax;
  auVar167._8_4_ = (int)(uVar1 >> 0x20);
  auVar167._0_8_ = uVar1;
  auVar167._12_4_ = 0x45300000;
  auVar70._0_8_ =
       (auVar167._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
  sVar2 = result->_iterations;
  auVar168._8_4_ = (int)(sVar2 >> 0x20);
  auVar168._0_8_ = sVar2;
  auVar168._12_4_ = 0x45300000;
  dVar77 = (double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0;
  dVar76 = auVar168._8_8_ - 1.9342813113834067e+25;
  uVar1 = result->_timeTotal;
  auVar199._8_4_ = (int)(uVar1 >> 0x20);
  auVar199._0_8_ = uVar1;
  auVar199._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar200._8_4_ = (int)(lVar5 >> 0x23);
  auVar200._0_8_ = lVar6;
  auVar200._12_4_ = 0x45300000;
  auVar70._8_8_ =
       ((auVar199._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
       ((auVar200._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
  auVar169._0_8_ = dVar76 + dVar77;
  auVar169._8_8_ = dVar76 + dVar77;
  auVar172 = divpd(auVar70,auVar169);
  auVar172 = divpd(_DAT_0013c190,auVar172);
  if (auVar172._8_8_ < auVar172._0_8_) {
    pcVar8 = "+";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,pcVar8,(ulong)(auVar172._8_8_ < auVar172._0_8_));
  uVar1 = result->_timeTotal;
  auVar71._8_4_ = (int)(uVar1 >> 0x20);
  auVar71._0_8_ = uVar1;
  auVar71._12_4_ = 0x45300000;
  lVar5 = (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(result->_runTimes).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar6 = lVar5 >> 3;
  auVar72._8_4_ = (int)(lVar5 >> 0x23);
  auVar72._0_8_ = lVar6;
  auVar72._12_4_ = 0x45300000;
  sVar2 = result->_iterations;
  auVar73._8_4_ = (int)(sVar2 >> 0x20);
  auVar73._0_8_ = sVar2;
  auVar73._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (((double)local_58 * 100.0) /
                      (1000000000.0 /
                      ((((auVar71._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                       ((auVar72._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))) /
                      ((auVar73._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," %",2);
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  poVar4 = local_40->_stream;
  *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 0x22;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Median performance: ",0x14);
  auVar74._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar74._8_4_ = (int)(result->_iterations >> 0x20);
  auVar74._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (result->_timeMedian /
                      ((auVar74._8_8_ - 1.9342813113834067e+25) +
                      (auVar74._0_8_ - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," iterations/s (",0xf);
  local_60[0] = TextCyan;
  poVar4 = operator<<(poVar4,local_60);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"1st quartile: ",0xe);
  auVar75._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar75._8_4_ = (int)(result->_iterations >> 0x20);
  auVar75._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (result->_timeQuartile1 /
                      ((auVar75._8_8_ - 1.9342813113834067e+25) +
                      (auVar75._0_8_ - 4503599627370496.0))));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," | 3rd quartile: ",0x11);
  auVar170._0_8_ = (double)CONCAT44(0x43300000,(int)result->_iterations);
  auVar170._8_4_ = (int)(result->_iterations >> 0x20);
  auVar170._12_4_ = 0x45300000;
  poVar4 = std::ostream::_M_insert<double>
                     (1000000000.0 /
                      (result->_timeQuartile3 /
                      ((auVar170._8_8_ - 1.9342813113834067e+25) +
                      (auVar170._0_8_ - 4503599627370496.0))));
  local_60[1] = 0;
  poVar4 = operator<<(poVar4,local_60 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return;
}

Assistant:

virtual void EndTest(const std::string& fixtureName,
                             const std::string& testName,
                             const TestParametersDescriptor& parameters,
                             const TestResult& result)
        {
#define PAD(x) _stream << std::setw(34) << x << std::endl;
#define PAD_DEVIATION(description,                                      \
                      deviated,                                         \
                      average,                                          \
                      unit)                                             \
            {                                                           \
                double _d_ =                                            \
                    double(deviated) - double(average);                 \
                                                                        \
                PAD(description <<                                      \
                    deviated << " " << unit << " (" <<                  \
                    (deviated < average ?                               \
                     Console::TextRed :                                 \
                     Console::TextGreen) <<                             \
                    (deviated > average ? "+" : "") <<                  \
                    _d_ << " " << unit << " / " <<                      \
                    (deviated > average ? "+" : "") <<                  \
                    (_d_ * 100.0 / average) << " %" <<                  \
                    Console::TextDefault << ")");                       \
            }
#define PAD_DEVIATION_INVERSE(description,                              \
                              deviated,                                 \
                              average,                                  \
                              unit)                                     \
            {                                                           \
                double _d_ =                                            \
                    double(deviated) - double(average);                 \
                                                                        \
                PAD(description <<                                      \
                    deviated << " " << unit << " (" <<                  \
                    (deviated > average ?                               \
                     Console::TextRed :                                 \
                     Console::TextGreen) <<                             \
                    (deviated > average ? "+" : "") <<                  \
                    _d_ << " " << unit << " / " <<                      \
                    (deviated > average ? "+" : "") <<                  \
                    (_d_ * 100.0 / average) << " %" <<                  \
                    Console::TextDefault << ")");                       \
            }

            _stream << Console::TextGreen << "[     DONE ]"
                    << Console::TextYellow << " ";
            WriteTestNameToStream(_stream, fixtureName, testName, parameters);
            _stream << Console::TextDefault << " ("
                    << std::setprecision(6)
                    << (result.TimeTotal() / 1000000.0) << " ms)"
                    << std::endl;

            _stream << Console::TextBlue << "[   RUNS   ] "
                    << Console::TextDefault
                    << "       Average time: "
                    << std::setprecision(3)
                    << result.RunTimeAverage() / 1000.0 << " us "
                    << "(" << Console::TextBlue << "~"
                    << result.RunTimeStdDev() / 1000.0 << " us"
                    << Console::TextDefault << ")"
                    << std::endl;

            PAD_DEVIATION_INVERSE("Fastest time: ",
                                  (result.RunTimeMinimum() / 1000.0),
                                  (result.RunTimeAverage() / 1000.0),
                                  "us");
            PAD_DEVIATION_INVERSE("Slowest time: ",
                                  (result.RunTimeMaximum() / 1000.0),
                                  (result.RunTimeAverage() / 1000.0),
                                  "us");
            PAD("Median time: " <<
                result.RunTimeMedian() / 1000.0 << " us (" <<
                Console::TextCyan << "1st quartile: " <<
                result.RunTimeQuartile1() / 1000.0 << " us | 3rd quartile: " <<
                result.RunTimeQuartile3() / 1000.0 << " us" <<
                Console::TextDefault << ")");

            _stream << std::setprecision(5);

            PAD("");
            PAD("Average performance: " <<
                result.RunsPerSecondAverage() << " runs/s");
            PAD_DEVIATION("Best performance: ",
                          result.RunsPerSecondMaximum(),
                          result.RunsPerSecondAverage(),
                          "runs/s");
            PAD_DEVIATION("Worst performance: ",
                          result.RunsPerSecondMinimum(),
                          result.RunsPerSecondAverage(),
                          "runs/s");
            PAD("Median performance: " <<
                result.RunsPerSecondMedian() << " runs/s (" <<
                Console::TextCyan << "1st quartile: " <<
                result.RunsPerSecondQuartile1() << " | 3rd quartile: " <<
                result.RunsPerSecondQuartile3() <<
                Console::TextDefault << ")");

            PAD("");
            _stream << Console::TextBlue << "[ITERATIONS] "
                    << Console::TextDefault
                    << std::setprecision(3)
                    << "       Average time: "
                    << result.IterationTimeAverage() / 1000.0 << " us "
                    << "(" << Console::TextBlue << "~"
                    << result.IterationTimeStdDev() / 1000.0 << " us"
                    << Console::TextDefault << ")"
                    << std::endl;

            PAD_DEVIATION_INVERSE("Fastest time: ",
                                  (result.IterationTimeMinimum() / 1000.0),
                                  (result.IterationTimeAverage() / 1000.0),
                                  "us");
            PAD_DEVIATION_INVERSE("Slowest time: ",
                                  (result.IterationTimeMaximum() / 1000.0),
                                  (result.IterationTimeAverage() / 1000.0),
                                  "us");
            PAD("Median time: " <<
                result.IterationTimeMedian() / 1000.0 << " us (" <<
                Console::TextCyan << "1st quartile: " <<
                result.IterationTimeQuartile1() / 1000.0 <<
                " us | 3rd quartile: " <<
                result.IterationTimeQuartile3() / 1000.0 << " us" <<
                Console::TextDefault << ")");

            _stream << std::setprecision(5);

            PAD("");
            PAD("Average performance: " <<
                result.IterationsPerSecondAverage() <<
                " iterations/s");
            PAD_DEVIATION("Best performance: ",
                          (result.IterationsPerSecondMaximum()),
                          (result.IterationsPerSecondAverage()),
                          "iterations/s");
            PAD_DEVIATION("Worst performance: ",
                          (result.IterationsPerSecondMinimum()),
                          (result.IterationsPerSecondAverage()),
                          "iterations/s");
            PAD("Median performance: " <<
                result.IterationsPerSecondMedian() << " iterations/s (" <<
                Console::TextCyan << "1st quartile: " <<
                result.IterationsPerSecondQuartile1() <<
                " | 3rd quartile: " <<
                result.IterationsPerSecondQuartile3() <<
                Console::TextDefault << ")");

#undef PAD_DEVIATION_INVERSE
#undef PAD_DEVIATION
#undef PAD
        }